

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

LabelId * __thiscall Parser::CreateLabelId(Parser *this,IdentPtr pid)

{
  LabelId *pLVar1;
  LabelId *pLabelId;
  IdentPtr pid_local;
  Parser *this_local;
  
  pLVar1 = (LabelId *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::AllocInternal
                     ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)this,
                      0x10);
  if (pLVar1 == (LabelId *)0x0) {
    Error(this,-0x7ff5fc17,L"",L"");
  }
  pLVar1->pid = pid;
  pLVar1->next = (LabelId *)0x0;
  return pLVar1;
}

Assistant:

LabelId* Parser::CreateLabelId(IdentPtr pid)
{
    LabelId* pLabelId;

    pLabelId = (LabelId*)m_nodeAllocator.Alloc(sizeof(LabelId));
    if (NULL == pLabelId)
        Error(ERRnoMemory);
    pLabelId->pid = pid;
    pLabelId->next = NULL;

    return pLabelId;
}